

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O0

Reflection * google::protobuf::internal::GetReflectionOrDie(Message *m)

{
  LogMessage *pLVar1;
  string_view local_58 [2];
  LogMessage local_38;
  Voidify local_21;
  Descriptor *local_20;
  Descriptor *d;
  Reflection *r;
  Message *m_local;
  
  r = (Reflection *)m;
  d = (Descriptor *)Message::GetReflection(m);
  if (d == (Descriptor *)0x0) {
    local_20 = Message::GetDescriptor((Message *)r);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_ops.cc"
               ,0x26);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar1,(char (*) [43])"Message does not support reflection (type ");
    if (local_20 == (Descriptor *)0x0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_58,"unknown");
    }
    else {
      local_58[0] = Descriptor::name(local_20);
    }
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,local_58[0]);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,(char (*) [3])0x745117)
    ;
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  return (Reflection *)d;
}

Assistant:

static const Reflection* GetReflectionOrDie(const Message& m) {
  const Reflection* r = m.GetReflection();
  if (r == nullptr) {
    const Descriptor* d = m.GetDescriptor();
    // RawMessage is one known type for which GetReflection() returns nullptr.
    ABSL_LOG(FATAL) << "Message does not support reflection (type "
                    << (d ? d->name() : "unknown") << ").";
  }
  return r;
}